

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O3

bool __thiscall ON_BoundingBox::GetEdges(ON_BoundingBox *this,ON_Line *edges)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  uint i;
  long lVar8;
  ON_Line line;
  ON_Line local_88;
  ON_Line local_58;
  
  ON_Line::ON_Line(&local_58);
  bVar7 = IsNotEmpty(this);
  if (bVar7) {
    lVar8 = 0;
    do {
      Edge(&local_88,this,(uint)lVar8);
      (edges->to).y = local_88.to.y;
      (edges->to).z = local_88.to.z;
      (edges->from).z = local_88.from.z;
      (edges->to).x = local_88.to.x;
      (edges->from).x = local_88.from.x;
      (edges->from).y = local_88.from.y;
      ON_Line::~ON_Line(&local_88);
      lVar8 = lVar8 + 1;
      edges = edges + 1;
    } while (lVar8 != 0xc);
  }
  else {
    (edges->from).z = ON_3dPoint::UnsetPoint.z;
    dVar2 = ON_3dPoint::UnsetPoint.y;
    (edges->from).x = ON_3dPoint::UnsetPoint.x;
    (edges->from).y = dVar2;
    dVar2 = ON_3dPoint::UnsetPoint.y;
    (edges->to).x = ON_3dPoint::UnsetPoint.x;
    (edges->to).y = dVar2;
    (edges->to).z = ON_3dPoint::UnsetPoint.z;
    lVar8 = 0x30;
    do {
      dVar2 = (edges->from).x;
      dVar3 = (edges->from).y;
      dVar4 = (edges->from).z;
      dVar5 = (edges->to).x;
      dVar6 = (edges->to).z;
      pdVar1 = (double *)((long)&(edges->to).y + lVar8);
      *pdVar1 = (edges->to).y;
      pdVar1[1] = dVar6;
      pdVar1 = (double *)((long)&(edges->from).z + lVar8);
      *pdVar1 = dVar4;
      pdVar1[1] = dVar5;
      pdVar1 = (double *)((long)&(edges->from).x + lVar8);
      *pdVar1 = dVar2;
      pdVar1[1] = dVar3;
      lVar8 = lVar8 + 0x30;
    } while (lVar8 != 0x240);
  }
  ON_Line::~ON_Line(&local_58);
  return bVar7;
}

Assistant:

bool ON_BoundingBox::GetEdges( 
  ON_Line edges[12] 
  ) const
{
  ON_Line line;
  bool rc = IsValid();
  if (rc)
  {
    for (unsigned i = 0U; i < 12; i++ )
    {
      edges[i] = Edge(i);
    }
  }
  else
  {
    edges[0].from = ON_3dPoint::UnsetPoint;
    edges[0].to   = ON_3dPoint::UnsetPoint;
    for (unsigned i = 1U; i < 12; i++ )
      edges[i] = edges[0];
  }

  return rc;
}